

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

Value * __thiscall cmGlobalGenerator::GetJson(Value *__return_storage_ptr__,cmGlobalGenerator *this)

{
  Value *this_00;
  string sStack_58;
  Value local_38;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  (*this->_vptr_cmGlobalGenerator[3])(&sStack_58,this);
  Json::Value::Value(&local_38,&sStack_58);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"name");
  Json::Value::operator=(this_00,&local_38);
  Json::Value::~Value(&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmGlobalGenerator::GetJson() const
{
  Json::Value generator = Json::objectValue;
  generator["name"] = this->GetName();
  return generator;
}